

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorPool::IsReadyForCheckingDescriptorExtDecl
          (DescriptorPool *this,string_view message_name)

{
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  int iVar1;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
  *this_01;
  long lVar2;
  undefined **ppuVar3;
  char **ppcVar4;
  byte bVar5;
  iterator iVar6;
  allocator_type local_73;
  key_equal local_72;
  hasher local_71;
  key_arg<std::basic_string_view<char>_> local_70;
  char *local_60 [10];
  
  local_70._M_str = message_name._M_str;
  local_70._M_len = message_name._M_len;
  bVar5 = 0;
  if (IsReadyForCheckingDescriptorExtDecl(std::basic_string_view<char,std::char_traits<char>>)::
      kDescriptorTypes_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&IsReadyForCheckingDescriptorExtDecl(std::basic_string_view<char,std::char_traits<char>>)
                                 ::kDescriptorTypes_abi_cxx11_);
    if (iVar1 != 0) {
      this_01 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                 *)operator_new(0x20);
      ppuVar3 = &PTR_anon_var_dwarf_1603ca_0045f700;
      ppcVar4 = local_60;
      for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
        *ppcVar4 = *ppuVar3;
        ppuVar3 = ppuVar3 + (ulong)bVar5 * -2 + 1;
        ppcVar4 = ppcVar4 + (ulong)bVar5 * -2 + 1;
      }
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
      ::raw_hash_set<char_const*const*>
                (this_01,local_60,(char **)&stack0xfffffffffffffff0,0,&local_71,&local_72,&local_73)
      ;
      IsReadyForCheckingDescriptorExtDecl(std::basic_string_view<char,std::char_traits<char>>)::
      kDescriptorTypes_abi_cxx11_ =
           (flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_01;
      __cxa_guard_release(&IsReadyForCheckingDescriptorExtDecl(std::basic_string_view<char,std::char_traits<char>>)
                           ::kDescriptorTypes_abi_cxx11_);
    }
  }
  this_00 = IsReadyForCheckingDescriptorExtDecl(std::basic_string_view<char,std::char_traits<char>>)
            ::kDescriptorTypes_abi_cxx11_;
  iVar6 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
          ::find<std::basic_string_view<char,std::char_traits<char>>>
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                      *)IsReadyForCheckingDescriptorExtDecl(std::basic_string_view<char,std::char_traits<char>>)
                        ::kDescriptorTypes_abi_cxx11_,&local_70);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::AssertNotDebugCapacity
            (&this_00->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  return iVar6.ctrl_ != (ctrl_t *)0x0;
}

Assistant:

bool DescriptorPool::IsReadyForCheckingDescriptorExtDecl(
    absl::string_view message_name) const {
  static const auto& kDescriptorTypes = *new absl::flat_hash_set<std::string>({
      "google.protobuf.EnumOptions",
      "google.protobuf.EnumValueOptions",
      "google.protobuf.ExtensionRangeOptions",
      "google.protobuf.FieldOptions",
      "google.protobuf.FileOptions",
      "google.protobuf.MessageOptions",
      "google.protobuf.MethodOptions",
      "google.protobuf.OneofOptions",
      "google.protobuf.ServiceOptions",
      "google.protobuf.StreamOptions",
  });
  return kDescriptorTypes.contains(message_name);
}